

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O1

bool Refal2::CReceptacle::IsValidKeyValue(CUnitList *keyValue)

{
  TUnitType TVar1;
  CNodeType *pCVar2;
  int iVar3;
  bool bVar4;
  
  pCVar2 = (keyValue->super_CNodeList<Refal2::CUnit>).first;
  bVar4 = pCVar2 != (CNodeType *)0x0;
  if (bVar4) {
    iVar3 = 0;
    do {
      if (((iVar3 == 0) && (((pCVar2->super_CUnit).type & UT_Char) != 0)) &&
         ((pCVar2->super_CUnit).field_1.c == '=')) {
        return bVar4;
      }
      TVar1 = (pCVar2->super_CUnit).type;
      if ((TVar1 & UT_LeftParen) == 0) {
        if ((TVar1 & UT_RightParen) != 0) {
          if (iVar3 < 1) {
            __assert_fail("depth > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                          ,0x60,
                          "static bool Refal2::CReceptacle::IsValidKeyValue(const CUnitList &)");
          }
          iVar3 = iVar3 + -1;
        }
      }
      else {
        iVar3 = iVar3 + 1;
      }
      pCVar2 = pCVar2->next;
      bVar4 = pCVar2 != (CNode<Refal2::CUnit> *)0x0;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool CReceptacle::IsValidKeyValue( const CUnitList& keyValue )
{
	int depth = 0;
	const CUnitNode* node = keyValue.GetFirst();
	while( node != nullptr ) {
		if( depth == 0 && isEqualNode( node ) ) {
			return true;
		}
		if( node->IsLeftParen() ) {
			depth++;
		} else if( node->IsRightParen() ) {
			assert( depth > 0 );
			depth--;
		}
		node = node->Next();
	}
	return false;
}